

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * ON_Font::InstalledFontFromRichTextProperties
                    (wchar_t *rtf_font_name,bool bRtfBold,bool bRtfItalic)

{
  bool bVar1;
  Weight prefered_weight;
  Style prefered_style;
  wchar_t *windows_logfont_name;
  ON_FontList *pOVar2;
  wchar_t *family_name_00;
  wchar_t *prefered_face_name;
  wchar_t local_160 [2];
  ON_Font *f;
  ON_FontFaceQuartet q;
  ON_wString face_name;
  ON_wString local_88;
  ON_wString family_name;
  wchar_t *separator;
  wchar_t hyphen [2];
  ON_Font *installed_font;
  wchar_t *ignore_prefered_face_name;
  wchar_t *ignore_family_name;
  wchar_t *ignore_windows_logfont_name;
  wchar_t *ignore_postscript_name;
  undefined1 local_40 [2];
  bool bStrikethrough;
  bool bUnderlined;
  Style preferred_style;
  Weight preferred_weight;
  bool bRequireStyleMatch;
  bool bRequireFaceMatch;
  ON_wString local_28;
  ON_wString local_rtf_font_name;
  bool bRtfItalic_local;
  bool bRtfBold_local;
  wchar_t *rtf_font_name_local;
  
  local_rtf_font_name.m_s._6_1_ = bRtfItalic;
  local_rtf_font_name.m_s._7_1_ = bRtfBold;
  ON_wString::ON_wString(&local_28,rtf_font_name);
  ON_wString::TrimLeftAndRight(&local_28,(wchar_t *)0x0);
  bVar1 = ON_wString::IsEmpty(&local_28);
  if (bVar1) {
    RichTextFontName((ON_Font *)local_40);
    ON_wString::operator=(&local_28,(ON_wString *)local_40);
    ON_wString::~ON_wString((ON_wString *)local_40);
  }
  windows_logfont_name = ON_wString::operator_cast_to_wchar_t_(&local_28);
  prefered_weight = (local_rtf_font_name.m_s._7_1_ & 1) + Medium;
  prefered_style = (local_rtf_font_name.m_s._6_1_ & 1) + Upright;
  pOVar2 = InstalledFontList();
  hyphen = (wchar_t  [2])
           ON_FontList::FromNames
                     (pOVar2,(wchar_t *)0x0,windows_logfont_name,(wchar_t *)0x0,(wchar_t *)0x0,
                      prefered_weight,Unset,prefered_style,true,false,false,false,0.0);
  if (hyphen == (wchar_t  [2])0x0) {
    pOVar2 = InstalledFontList();
    hyphen = (wchar_t  [2])
             ON_FontList::FromNames
                       (pOVar2,windows_logfont_name,(wchar_t *)0x0,(wchar_t *)0x0,(wchar_t *)0x0,
                        prefered_weight,Unset,prefered_style,true,false,false,false,0.0);
    if (hyphen == (wchar_t  [2])0x0) {
      separator = (wchar_t *)0x2d;
      family_name.m_s = windows_logfont_name;
      do {
        do {
          family_name.m_s = family_name.m_s + 1;
          if (*family_name.m_s == L'\0') goto LAB_0062409f;
        } while ((*family_name.m_s != L' ') && (*family_name.m_s != L'-'));
        ON_wString::ON_wString
                  (&local_88,windows_logfont_name,
                   (int)((ulong)((long)family_name.m_s - (long)windows_logfont_name) >> 2));
        ON_wString::TrimLeftAndRight(&local_88,(wchar_t *)0x0);
        ON_wString::TrimLeftAndRight(&local_88,(wchar_t *)&separator);
        ON_wString::TrimLeftAndRight(&local_88,(wchar_t *)0x0);
        bVar1 = ON_wString::IsEmpty(&local_88);
        if (bVar1) {
          face_name.m_s._4_4_ = 6;
        }
        else {
          ON_wString::ON_wString((ON_wString *)&q.m_bold_italic,family_name.m_s + 1);
          ON_wString::TrimLeftAndRight((ON_wString *)&q.m_bold_italic,(wchar_t *)0x0);
          ON_wString::TrimLeftAndRight((ON_wString *)&q.m_bold_italic,(wchar_t *)&separator);
          ON_wString::TrimLeftAndRight((ON_wString *)&q.m_bold_italic,(wchar_t *)0x0);
          bVar1 = ON_wString::IsEmpty((ON_wString *)&q.m_bold_italic);
          if (bVar1) {
            face_name.m_s._4_4_ = 6;
          }
          else {
            pOVar2 = InstalledFontList();
            family_name_00 = ON_wString::operator_cast_to_wchar_t_(&local_88);
            prefered_face_name =
                 ON_wString::operator_cast_to_wchar_t_((ON_wString *)&q.m_bold_italic);
            hyphen = (wchar_t  [2])
                     ON_FontList::FromNames
                               (pOVar2,(wchar_t *)0x0,(wchar_t *)0x0,family_name_00,
                                prefered_face_name,prefered_weight,Unset,prefered_style,true,false,
                                false,false,0.0);
            if (hyphen == (wchar_t  [2])0x0) {
              face_name.m_s._4_4_ = 0;
            }
            else {
              face_name.m_s._4_4_ = 4;
            }
          }
          ON_wString::~ON_wString((ON_wString *)&q.m_bold_italic);
        }
        ON_wString::~ON_wString(&local_88);
      } while ((face_name.m_s._4_4_ == 0) || (face_name.m_s._4_4_ != 4));
LAB_0062409f:
      if (hyphen == (wchar_t  [2])0x0) {
        pOVar2 = InstalledFontList();
        hyphen = (wchar_t  [2])
                 ON_FontList::FromNames
                           (pOVar2,(wchar_t *)0x0,(wchar_t *)0x0,windows_logfont_name,(wchar_t *)0x0
                            ,prefered_weight,Unset,prefered_style,true,false,false,false,0.0);
      }
    }
  }
  if (hyphen == (wchar_t  [2])0x0) {
    rtf_font_name_local = (wchar_t *)0x0;
  }
  else {
    InstalledFontQuartet((ON_FontFaceQuartet *)&f,(ON_Font *)hyphen);
    local_160 = (wchar_t  [2])
                ON_FontFaceQuartet::ClosestFace
                          ((ON_FontFaceQuartet *)&f,(bool)(local_rtf_font_name.m_s._7_1_ & 1),
                           (bool)(local_rtf_font_name.m_s._6_1_ & 1));
    if (local_160 == (wchar_t  [2])0x0) {
      local_160[0] = hyphen[0];
      local_160[1] = hyphen[1];
    }
    rtf_font_name_local = (wchar_t *)local_160;
    ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)&f);
  }
  ON_wString::~ON_wString(&local_28);
  return (ON_Font *)rtf_font_name_local;
}

Assistant:

const ON_Font* ON_Font::InstalledFontFromRichTextProperties(
  const wchar_t* rtf_font_name,
  bool bRtfBold,
  bool bRtfItalic
)
{
  ON_wString local_rtf_font_name(rtf_font_name);
  local_rtf_font_name.TrimLeftAndRight();
  if (local_rtf_font_name.IsEmpty())
    local_rtf_font_name = ON_Font::Default.RichTextFontName();
  rtf_font_name = local_rtf_font_name;

  // It is critical that bRequireFaceMatch because the input name must
  // clearly identify a font in some way. The search below allows for this
  // name to appear in various contexts (LOGFONT, PostScript, Family+Face, Family).
  const bool bRequireFaceMatch = true;

  // It is critical that bRequireStyleMatch = false. See below
  const bool bRequireStyleMatch = false;

  // The preferred_weight is a bias used to pick between faces that have matching name properties.
  // An exact match is not required because bRequireStyleMatch = false;
  const ON_Font::Weight preferred_weight = bRtfBold ? ON_Font::Weight::Semibold : ON_Font::Weight::Medium;

  // The preferred_style is a bias used to pick between faces that have matching name properties.
  // An exact match is not required because bRequireStyleMatch = false;
  const ON_Font::Style preferred_style = bRtfItalic ? ON_Font::Style::Italic : ON_Font::Style::Upright;

  const bool bUnderlined = false;
  const bool bStrikethrough = false;
  const wchar_t* ignore_postscript_name = nullptr;
  const wchar_t* ignore_windows_logfont_name = nullptr;
  const wchar_t* ignore_family_name = nullptr;
  const wchar_t* ignore_prefered_face_name = nullptr;


  // 1st: Try LOGFONT name. For Windows this is the very best choice.
  // For MacOS this works the best in practice. If it fails, we move onto PostScript.
  const ON_Font* installed_font = ON_Font::InstalledFontList().FromNames(
    ignore_postscript_name,
    rtf_font_name, // windows_logfont_name,
    ignore_family_name,
    ignore_prefered_face_name,
    preferred_weight, ON_Font::Stretch::Unset, preferred_style,
    bRequireFaceMatch, bRequireStyleMatch, bUnderlined, bStrikethrough,
    0.0
  );

  while (nullptr == installed_font)
  {

    // 2nd: Try PostScript name
    installed_font = ON_Font::InstalledFontList().FromNames(
      rtf_font_name, // postscript_name,
      ignore_windows_logfont_name,
      ignore_family_name,
      ignore_prefered_face_name,
      preferred_weight, ON_Font::Stretch::Unset, preferred_style,
      bRequireFaceMatch, bRequireStyleMatch, bUnderlined, bStrikethrough,
      0.0
    );
    if (nullptr != installed_font)
      break;

    // 3rd: Try Family + Face name
    const wchar_t hyphen[2] = {ON_wString::HyphenMinus,0};
    for (const wchar_t* separator = rtf_font_name + 1; 0 != *separator; ++separator)
    {
      if (ON_wString::Space != *separator && ON_wString::HyphenMinus != *separator)
        continue;
      ON_wString family_name(rtf_font_name, (int)(separator - rtf_font_name));
      family_name.TrimLeftAndRight();
      family_name.TrimLeftAndRight(hyphen);
      family_name.TrimLeftAndRight();
      if (family_name.IsEmpty())
        continue;
      ON_wString face_name(separator + 1);
      face_name.TrimLeftAndRight();
      face_name.TrimLeftAndRight(hyphen);
      face_name.TrimLeftAndRight();
      if (face_name.IsEmpty())
        continue;

      installed_font = ON_Font::InstalledFontList().FromNames(
        ignore_postscript_name,
        ignore_windows_logfont_name,
        family_name, face_name,
        preferred_weight, ON_Font::Stretch::Unset, preferred_style,
        bRequireFaceMatch, bRequireStyleMatch, bUnderlined, bStrikethrough,
        0.0
      );
      if (nullptr != installed_font)
        break;
    }
    if (nullptr != installed_font)
      break;


    // 4th: Try Family name
    installed_font = ON_Font::InstalledFontList().FromNames(
      ignore_postscript_name,
      ignore_windows_logfont_name,
      rtf_font_name, // family name
      ignore_prefered_face_name,
      preferred_weight, ON_Font::Stretch::Unset, preferred_style,
      bRequireFaceMatch, bRequireStyleMatch, bUnderlined, bStrikethrough,
      0.0
    );
    if (nullptr != installed_font)
      break;

    // No installed font comes close to matching the input name parameter 
    break;
  }

  if (nullptr != installed_font)
  {
    const ON_FontFaceQuartet q = installed_font->InstalledFontQuartet(); // only look at installed quartet!
    const ON_Font* f = q.ClosestFace(bRtfBold, bRtfItalic);
    return (nullptr != f) ? f : installed_font;
  }

  return nullptr;
}